

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftOffRequest.h
# Opt level: O0

bool __thiscall ShiftOffRequest::operator==(ShiftOffRequest *this,ShiftOffRequest *shiftOffRequest)

{
  __type _Var1;
  string *psVar2;
  __type local_19;
  ShiftOffRequest *shiftOffRequest_local;
  ShiftOffRequest *this_local;
  
  psVar2 = getNurse_abi_cxx11_(shiftOffRequest);
  _Var1 = std::operator==(&this->nurse,psVar2);
  local_19 = true;
  if (!_Var1) {
    psVar2 = getDay_abi_cxx11_(shiftOffRequest);
    _Var1 = std::operator==(&this->day,psVar2);
    local_19 = true;
    if (!_Var1) {
      psVar2 = getShiftType_abi_cxx11_(shiftOffRequest);
      local_19 = std::operator==(&this->shiftType,psVar2);
    }
  }
  return local_19;
}

Assistant:

bool operator== (const ShiftOffRequest& shiftOffRequest) {
        return nurse ==shiftOffRequest.getNurse() ||  day == shiftOffRequest.getDay() || shiftType ==shiftOffRequest.getShiftType();
    }